

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O1

void mf_print_offset_features(gdmf *d,example *ec,size_t offset)

{
  sparse_parameters *this;
  float fVar1;
  byte bVar2;
  vw *pvVar3;
  byte *pbVar4;
  float *pfVar5;
  float *pfVar6;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  unsigned_long *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  pointer pbVar12;
  float *pfVar13;
  element_type *peVar14;
  long lVar15;
  ostream *poVar16;
  weight *pwVar17;
  byte *pbVar18;
  vw_exception *this_00;
  long lVar19;
  pointer pbVar20;
  long lVar21;
  bool bVar22;
  stringstream __msg;
  ulong local_268;
  ulong *local_260;
  float *local_258;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_238;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  pvVar3 = d->all;
  pbVar18 = (ec->super_example_predict).indices._begin;
  pbVar4 = (ec->super_example_predict).indices._end;
  if (pbVar18 != pbVar4) {
    do {
      bVar2 = *pbVar18;
      pfVar5 = (ec->super_example_predict).feature_space[bVar2].values._begin;
      pfVar6 = (ec->super_example_predict).feature_space[bVar2].values._end;
      if (pfVar5 != pfVar6) {
        psVar7 = (ec->super_example_predict).feature_space[bVar2].space_names._begin;
        psVar8 = (ec->super_example_predict).feature_space[bVar2].space_names._end;
        puVar9 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
        lVar19 = 0;
        do {
          local_1b8[0] = (stringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1b8,1);
          if (psVar7 != psVar8) {
            puVar10 = *(undefined8 **)
                       ((long)&(psVar7->
                               super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar19 * 4);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)*puVar10,puVar10[1]);
            local_1b8[0] = (stringstream)0x5e;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(char *)local_1b8,1);
            lVar21 = *(long *)((long)&(psVar7->
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar19 * 4);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,*(char **)(lVar21 + 0x20),*(long *)(lVar21 + 0x28));
            local_1b8[0] = (stringstream)0x3a;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_1b8,1);
          }
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
          local_1b8[0] = (stringstream)0x3a;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_1b8,1);
          std::ostream::_M_insert<double>((double)*(float *)((long)pfVar5 + lVar19));
          local_1b8[0] = (stringstream)0x3a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1b8,1);
          uVar11 = *(ulong *)((long)puVar9 + lVar19 * 2);
          if ((pvVar3->weights).sparse == true) {
            pwVar17 = sparse_parameters::operator[](&(pvVar3->weights).sparse_weights,uVar11);
          }
          else {
            pwVar17 = (pvVar3->weights).dense_weights._begin +
                      (uVar11 & (pvVar3->weights).dense_weights._weight_mask);
          }
          std::ostream::_M_insert<double>((double)pwVar17[offset]);
          lVar21 = lVar19 + 4;
          lVar19 = lVar19 + 4;
        } while ((float *)((long)pfVar5 + lVar21) != pfVar6);
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar4);
  }
  pbVar20 = (pvVar3->pairs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (pvVar3->pairs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar20 != pbVar12) {
    this = &(pvVar3->weights).sparse_weights;
    do {
      pbVar18 = (byte *)(pbVar20->_M_dataplus)._M_p;
      bVar2 = *pbVar18;
      if ((((ec->super_example_predict).feature_space[bVar2].values._end !=
            (ec->super_example_predict).feature_space[bVar2].values._begin) &&
          (bVar2 = pbVar18[1],
          (ec->super_example_predict).feature_space[bVar2].values._end !=
          (ec->super_example_predict).feature_space[bVar2].values._begin)) && (d->rank != 0)) {
        local_268 = 1;
        do {
          bVar2 = *(pbVar20->_M_dataplus)._M_p;
          local_258 = (ec->super_example_predict).feature_space[bVar2].values._begin;
          pfVar5 = (ec->super_example_predict).feature_space[bVar2].values._end;
          if (local_258 != pfVar5) {
            local_260 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
            local_238 = (ec->super_example_predict).feature_space[bVar2].space_names._begin;
            lVar19 = local_268 + offset;
            do {
              bVar2 = (pbVar20->_M_dataplus)._M_p[1];
              pfVar6 = (ec->super_example_predict).feature_space[bVar2].values._begin;
              pfVar13 = (ec->super_example_predict).feature_space[bVar2].values._end;
              if (pfVar6 != pfVar13) {
                puVar9 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
                psVar7 = (ec->super_example_predict).feature_space[bVar2].space_names._begin;
                lVar21 = 0;
                do {
                  local_1b8[0] = (stringstream)0x9;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_1b8,1);
                  peVar14 = (local_238->
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,*(char **)&peVar14->first,
                                       *(size_type *)((long)&peVar14->first + 8));
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  local_1b8[0] = (stringstream)0x5e;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)local_1b8,1);
                  peVar14 = (local_238->
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(peVar14->second)._M_dataplus._M_p,
                                       *(size_type *)((long)&peVar14->second + 8));
                  local_1b8[0] = (stringstream)0x3a;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)local_1b8,1);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
                  local_1b8[0] = (stringstream)0x3a;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_1b8,1);
                  std::ostream::_M_insert<double>((double)*local_258);
                  local_1b8[0] = (stringstream)0x3a;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_1b8,1);
                  if ((pvVar3->weights).sparse == true) {
                    pwVar17 = sparse_parameters::operator[](this,*local_260);
                  }
                  else {
                    pwVar17 = (pvVar3->weights).dense_weights._begin +
                              (*local_260 & (pvVar3->weights).dense_weights._weight_mask);
                  }
                  std::ostream::_M_insert<double>((double)pwVar17[lVar19]);
                  local_1b8[0] = (stringstream)0x3a;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_1b8,1);
                  puVar10 = *(undefined8 **)
                             ((long)&(psVar7->
                                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar21 * 4);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)*puVar10,puVar10[1]);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  local_1b8[0] = (stringstream)0x5e;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)local_1b8,1);
                  lVar15 = *(long *)((long)&(psVar7->
                                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar21 * 4);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,*(char **)(lVar15 + 0x20),*(long *)(lVar15 + 0x28));
                  local_1b8[0] = (stringstream)0x3a;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)local_1b8,1);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
                  local_1b8[0] = (stringstream)0x3a;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_1b8,1);
                  std::ostream::_M_insert<double>((double)*(float *)((long)pfVar6 + lVar21));
                  local_1b8[0] = (stringstream)0x3a;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_1b8,1);
                  uVar11 = *(ulong *)((long)puVar9 + lVar21 * 2);
                  if ((pvVar3->weights).sparse == true) {
                    pwVar17 = sparse_parameters::operator[](this,uVar11);
                  }
                  else {
                    pwVar17 = (pvVar3->weights).dense_weights._begin +
                              (uVar11 & (pvVar3->weights).dense_weights._weight_mask);
                  }
                  std::ostream::_M_insert<double>((double)pwVar17[lVar19 + (ulong)d->rank]);
                  local_1b8[0] = (stringstream)0x3a;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_1b8,1);
                  if ((pvVar3->weights).sparse == true) {
                    pwVar17 = sparse_parameters::operator[](this,*local_260);
                  }
                  else {
                    pwVar17 = (pvVar3->weights).dense_weights._begin +
                              (*local_260 & (pvVar3->weights).dense_weights._weight_mask);
                  }
                  fVar1 = pwVar17[lVar19];
                  uVar11 = *(ulong *)((long)puVar9 + lVar21 * 2);
                  if ((pvVar3->weights).sparse == true) {
                    pwVar17 = sparse_parameters::operator[](this,uVar11);
                  }
                  else {
                    pwVar17 = (pvVar3->weights).dense_weights._begin +
                              (uVar11 & (pvVar3->weights).dense_weights._weight_mask);
                  }
                  std::ostream::_M_insert<double>
                            ((double)(fVar1 * pwVar17[lVar19 + (ulong)d->rank]));
                  lVar15 = lVar21 + 4;
                  lVar21 = lVar21 + 4;
                } while ((float *)((long)pfVar6 + lVar15) != pfVar13);
              }
              local_258 = local_258 + 1;
              local_260 = local_260 + 1;
              local_238 = local_238 + 1;
            } while (local_258 != pfVar5);
          }
          bVar22 = local_268 < d->rank;
          local_268 = local_268 + 1;
        } while (bVar22);
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar12);
  }
  if ((pvVar3->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pvVar3->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1a8,"cannot use triples in matrix factorization",0x2a);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
             ,0x4c,&local_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void mf_print_offset_features(gdmf& d, example& ec, size_t offset)
{
  vw& all = *d.all;
  parameters& weights = all.weights;
  uint64_t mask = weights.mask();
  for (features& fs : ec)
  {
    bool audit = !fs.space_names.empty();
    for (auto& f : fs.values_indices_audit())
    {
      cout << '\t';
      if (audit)
        cout << f.audit().get()->first << '^' << f.audit().get()->second << ':';
      cout << f.index() << "(" << ((f.index() + offset) & mask) << ")" << ':' << f.value();
      cout << ':' << (&weights[f.index()])[offset];
    }
  }
  for (string& i : all.pairs)
    if (ec.feature_space[(unsigned char)i[0]].size() > 0 && ec.feature_space[(unsigned char)i[1]].size() > 0)
    {
      /* print out nsk^feature:hash:value:weight:nsk^feature^:hash:value:weight:prod_weights */
      for (size_t k = 1; k <= d.rank; k++)
      {
        for (features::iterator_all& f1 : ec.feature_space[(unsigned char)i[0]].values_indices_audit())
          for (features::iterator_all& f2 : ec.feature_space[(unsigned char)i[1]].values_indices_audit())
          {
            cout << '\t' << f1.audit().get()->first << k << '^' << f1.audit().get()->second << ':'
                 << ((f1.index() + k) & mask) << "(" << ((f1.index() + offset + k) & mask) << ")" << ':' << f1.value();
            cout << ':' << (&weights[f1.index()])[offset + k];

            cout << ':' << f2.audit().get()->first << k << '^' << f2.audit().get()->second << ':'
                 << ((f2.index() + k + d.rank) & mask) << "(" << ((f2.index() + offset + k + d.rank) & mask) << ")"
                 << ':' << f2.value();
            cout << ':' << (&weights[f2.index()])[offset + k + d.rank];

            cout << ':' << (&weights[f1.index()])[offset + k] * (&weights[f2.index()])[offset + k + d.rank];
          }
      }
    }
  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");
  cout << endl;
}